

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

RegexFlags __thiscall
Js::JavascriptRegExp::SetRegexFlag
          (JavascriptRegExp *this,PropertyId propertyId,RegexFlags flags,RegexFlags flag,
          ScriptContext *scriptContext)

{
  bool bVar1;
  Var aValue;
  undefined1 local_22;
  bool isEnabled;
  ScriptContext *scriptContext_local;
  RegexFlags flag_local;
  RegexFlags flags_local;
  PropertyId propertyId_local;
  JavascriptRegExp *this_local;
  
  aValue = Js::JavascriptOperators::GetProperty
                     ((RecyclableObject *)this,propertyId,scriptContext,(PropertyValueInfo *)0x0);
  bVar1 = JavascriptConversion::ToBool(aValue,scriptContext);
  if (bVar1) {
    local_22 = flags | flag;
  }
  else {
    local_22 = flags & (flag ^ ~NoRegexFlags);
  }
  return local_22;
}

Assistant:

UnifiedRegex::RegexFlags JavascriptRegExp::SetRegexFlag(
        PropertyId propertyId,
        UnifiedRegex::RegexFlags flags,
        UnifiedRegex::RegexFlags flag,
        ScriptContext* scriptContext)
    {
        bool isEnabled = JavascriptConversion::ToBool(
            JavascriptOperators::GetProperty(this, propertyId, scriptContext),
            scriptContext);
        return isEnabled
            ? static_cast<UnifiedRegex::RegexFlags>(flags | flag)
            : static_cast<UnifiedRegex::RegexFlags>(flags & ~flag);
    }